

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Utility.cpp
# Opt level: O2

bool amrex::is_integer(char *str)

{
  char *pcVar1;
  size_t sVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  
  if (str == (char *)0x0) {
    return false;
  }
  sVar2 = strlen(str);
  uVar3 = 0;
  iVar4 = (int)sVar2;
  if (iVar4 != 0) {
    uVar5 = 0;
    if (0 < iVar4) {
      uVar5 = sVar2 & 0xffffffff;
    }
    do {
      if (uVar5 == uVar3) {
        uVar3 = (ulong)((long)iVar4 <= (long)uVar3);
        goto LAB_003f91d7;
      }
      pcVar1 = str + uVar3;
      uVar3 = uVar3 + 1;
    } while ((int)*pcVar1 - 0x30U < 10);
    uVar3 = 0;
  }
LAB_003f91d7:
  return SUB81(uVar3,0);
}

Assistant:

bool
amrex::is_integer (const char* str)
{
    int len = 0;

    if (str == 0 || (len = strlen(str)) == 0)
        return false;

    for (int i = 0; i < len; i++)
        if (!isdigit(str[i]))
            return false;

    return true;
}